

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

bool cmSystemTools::SimpleGlob
               (string *glob,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *files,int type)

{
  int iVar1;
  Status SVar2;
  unsigned_long uVar3;
  char *pcVar4;
  uint uVar5;
  ulong dindex;
  bool bVar6;
  bool bVar7;
  basic_string_view<char,_std::char_traits<char>_> __str;
  Directory d;
  string fname;
  string sfname;
  string path;
  string ppath;
  allocator<char> local_d9;
  Directory local_d8;
  string local_d0;
  int local_ac;
  long *local_a8;
  size_t local_a0;
  long local_98 [2];
  string local_88;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_48;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  local_ac = type;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(files,(files->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start);
  if ((glob->_M_dataplus)._M_p[glob->_M_string_length - 1] == '*') {
    cmsys::SystemTools::GetFilenamePath(&local_88,glob);
    cmsys::SystemTools::GetFilenameName(&local_68,glob);
    std::__cxx11::string::substr((ulong)&local_d0,(ulong)&local_68);
    std::__cxx11::string::operator=((string *)&local_68,(string *)&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if (local_88._M_string_length == 0) {
      std::__cxx11::string::_M_replace((ulong)&local_88,0,(char *)0x0,0x80020a);
    }
    cmsys::Directory::Directory(&local_d8);
    SVar2 = cmsys::Directory::Load(&local_d8,&local_88,(string *)0x0);
    uVar5 = 0;
    bVar6 = false;
    if (SVar2.Kind_ == Success) {
      bVar6 = false;
      local_48 = files;
      while( true ) {
        uVar3 = cmsys::Directory::GetNumberOfFiles(&local_d8);
        dindex = (ulong)uVar5;
        if (uVar3 <= dindex) break;
        pcVar4 = cmsys::Directory::GetFile(&local_d8,dindex);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d0,pcVar4,(allocator<char> *)&local_40);
        iVar1 = std::__cxx11::string::compare((char *)&local_d0);
        if (iVar1 == 0) {
          bVar7 = false;
        }
        else {
          pcVar4 = cmsys::Directory::GetFile(&local_d8,dindex);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,pcVar4,&local_d9);
          iVar1 = std::__cxx11::string::compare((char *)&local_a8);
          bVar7 = iVar1 != 0;
          if (local_a8 != local_98) {
            operator_delete(local_a8,local_98[0] + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        if (bVar7) {
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d0,local_88._M_dataplus._M_p,
                     local_88._M_dataplus._M_p + local_88._M_string_length);
          if (local_88._M_dataplus._M_p[local_88._M_string_length - 1] != '/') {
            std::__cxx11::string::append((char *)&local_d0);
          }
          cmsys::Directory::GetFile(&local_d8,dindex);
          std::__cxx11::string::append((char *)&local_d0);
          pcVar4 = cmsys::Directory::GetFile(&local_d8,dindex);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a8,pcVar4,(allocator<char> *)&local_40);
          if (local_ac < 1) {
            if ((-1 < local_ac) || (bVar7 = cmsys::SystemTools::FileIsDirectory(&local_d0), bVar7))
            goto LAB_001db48b;
          }
          else {
            bVar7 = cmsys::SystemTools::FileIsDirectory(&local_d0);
            if (!bVar7) {
LAB_001db48b:
              local_40._M_len = local_a0;
              local_40._M_str = (char *)local_a8;
              __str._M_str = local_68._M_dataplus._M_p;
              __str._M_len = local_68._M_string_length;
              iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                (&local_40,0,local_68._M_string_length,__str);
              if (iVar1 == 0) {
                bVar6 = true;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(local_48,&local_d0);
              }
            }
          }
          if (local_a8 != local_98) {
            operator_delete(local_a8,local_98[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
        }
        uVar5 = uVar5 + 1;
      }
    }
    cmsys::Directory::~Directory(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool cmSystemTools::SimpleGlob(const std::string& glob,
                               std::vector<std::string>& files,
                               int type /* = 0 */)
{
  files.clear();
  if (glob.back() != '*') {
    return false;
  }
  std::string path = cmSystemTools::GetFilenamePath(glob);
  std::string ppath = cmSystemTools::GetFilenameName(glob);
  ppath = ppath.substr(0, ppath.size() - 1);
  if (path.empty()) {
    path = "/";
  }

  bool res = false;
  cmsys::Directory d;
  if (d.Load(path)) {
    for (unsigned int i = 0; i < d.GetNumberOfFiles(); ++i) {
      if ((std::string(d.GetFile(i)) != ".") &&
          (std::string(d.GetFile(i)) != "..")) {
        std::string fname = path;
        if (path.back() != '/') {
          fname += "/";
        }
        fname += d.GetFile(i);
        std::string sfname = d.GetFile(i);
        if (type > 0 && cmSystemTools::FileIsDirectory(fname)) {
          continue;
        }
        if (type < 0 && !cmSystemTools::FileIsDirectory(fname)) {
          continue;
        }
        if (cmHasPrefix(sfname, ppath)) {
          files.push_back(fname);
          res = true;
        }
      }
    }
  }
  return res;
}